

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionLhs<const_xll::expected<float,_long>_&>::endExpression
          (ExpressionLhs<const_xll::expected<float,_long>_&> *this)

{
  ResultBuilder *pRVar1;
  Catch local_38 [39];
  byte local_11;
  ExpressionLhs<const_xll::expected<float,_long>_&> *pEStack_10;
  bool value;
  ExpressionLhs<const_xll::expected<float,_long>_&> *this_local;
  
  pEStack_10 = this;
  local_11 = xll::expected::operator_cast_to_bool((expected *)this->m_lhs);
  pRVar1 = this->m_rb;
  Catch::toString_abi_cxx11_(local_38,(bool)local_11);
  pRVar1 = ResultBuilder::setLhs(pRVar1,(string *)local_38);
  pRVar1 = ResultBuilder::setResultType(pRVar1,(bool)(local_11 & 1));
  ResultBuilder::endExpression(pRVar1);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }